

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

void mbedtls_x509_crt_free(mbedtls_x509_crt *crt)

{
  mbedtls_x509_crt **ppmVar1;
  mbedtls_asn1_named_data *pmVar2;
  mbedtls_asn1_sequence *pmVar3;
  mbedtls_x509_crt *pmVar4;
  mbedtls_x509_sequence *seq_prv;
  mbedtls_x509_sequence *seq_cur;
  mbedtls_x509_name *name_prv;
  mbedtls_x509_name *name_cur;
  mbedtls_x509_crt *cert_prv;
  mbedtls_x509_crt *cert_cur;
  mbedtls_x509_crt *crt_local;
  
  pmVar4 = crt;
  if (crt != (mbedtls_x509_crt *)0x0) {
    do {
      cert_prv = pmVar4;
      mbedtls_pk_free(&cert_prv->pk);
      free(cert_prv->sig_opts);
      name_prv = (cert_prv->issuer).next;
      while (name_prv != (mbedtls_x509_name *)0x0) {
        pmVar2 = name_prv->next;
        mbedtls_zeroize(name_prv,0x40);
        free(name_prv);
        name_prv = pmVar2;
      }
      name_prv = (cert_prv->subject).next;
      while (name_prv != (mbedtls_x509_name *)0x0) {
        pmVar2 = name_prv->next;
        mbedtls_zeroize(name_prv,0x40);
        free(name_prv);
        name_prv = pmVar2;
      }
      seq_prv = (cert_prv->ext_key_usage).next;
      while (seq_prv != (mbedtls_x509_sequence *)0x0) {
        pmVar3 = seq_prv->next;
        mbedtls_zeroize(seq_prv,0x20);
        free(seq_prv);
        seq_prv = pmVar3;
      }
      seq_prv = (cert_prv->subject_alt_names).next;
      while (seq_prv != (mbedtls_x509_sequence *)0x0) {
        pmVar3 = seq_prv->next;
        mbedtls_zeroize(seq_prv,0x20);
        free(seq_prv);
        seq_prv = pmVar3;
      }
      if ((cert_prv->raw).p != (uchar *)0x0) {
        mbedtls_zeroize((cert_prv->raw).p,(cert_prv->raw).len);
        free((cert_prv->raw).p);
      }
      ppmVar1 = &cert_prv->next;
      cert_prv = crt;
      pmVar4 = *ppmVar1;
    } while (*ppmVar1 != (mbedtls_x509_crt *)0x0);
    do {
      pmVar4 = cert_prv->next;
      mbedtls_zeroize(cert_prv,0x228);
      if (cert_prv != crt) {
        free(cert_prv);
      }
      cert_prv = pmVar4;
    } while (pmVar4 != (mbedtls_x509_crt *)0x0);
  }
  return;
}

Assistant:

void mbedtls_x509_crt_free( mbedtls_x509_crt *crt )
{
    mbedtls_x509_crt *cert_cur = crt;
    mbedtls_x509_crt *cert_prv;
    mbedtls_x509_name *name_cur;
    mbedtls_x509_name *name_prv;
    mbedtls_x509_sequence *seq_cur;
    mbedtls_x509_sequence *seq_prv;

    if( crt == NULL )
        return;

    do
    {
        mbedtls_pk_free( &cert_cur->pk );

#if defined(MBEDTLS_X509_RSASSA_PSS_SUPPORT)
        mbedtls_free( cert_cur->sig_opts );
#endif

        name_cur = cert_cur->issuer.next;
        while( name_cur != NULL )
        {
            name_prv = name_cur;
            name_cur = name_cur->next;
            mbedtls_zeroize( name_prv, sizeof( mbedtls_x509_name ) );
            mbedtls_free( name_prv );
        }

        name_cur = cert_cur->subject.next;
        while( name_cur != NULL )
        {
            name_prv = name_cur;
            name_cur = name_cur->next;
            mbedtls_zeroize( name_prv, sizeof( mbedtls_x509_name ) );
            mbedtls_free( name_prv );
        }

        seq_cur = cert_cur->ext_key_usage.next;
        while( seq_cur != NULL )
        {
            seq_prv = seq_cur;
            seq_cur = seq_cur->next;
            mbedtls_zeroize( seq_prv, sizeof( mbedtls_x509_sequence ) );
            mbedtls_free( seq_prv );
        }

        seq_cur = cert_cur->subject_alt_names.next;
        while( seq_cur != NULL )
        {
            seq_prv = seq_cur;
            seq_cur = seq_cur->next;
            mbedtls_zeroize( seq_prv, sizeof( mbedtls_x509_sequence ) );
            mbedtls_free( seq_prv );
        }

        if( cert_cur->raw.p != NULL )
        {
            mbedtls_zeroize( cert_cur->raw.p, cert_cur->raw.len );
            mbedtls_free( cert_cur->raw.p );
        }

        cert_cur = cert_cur->next;
    }
    while( cert_cur != NULL );

    cert_cur = crt;
    do
    {
        cert_prv = cert_cur;
        cert_cur = cert_cur->next;

        mbedtls_zeroize( cert_prv, sizeof( mbedtls_x509_crt ) );
        if( cert_prv != crt )
            mbedtls_free( cert_prv );
    }
    while( cert_cur != NULL );
}